

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O3

string * __thiscall
absl::lts_20250127::log_internal::FormatLogMessage_abi_cxx11_
          (string *__return_storage_ptr__,log_internal *this,LogSeverity severity,
          CivilSecond civil_second,Duration subsecond,Tid tid,string_view basename,int line,
          PrefixFormat format,string_view message)

{
  char *args;
  Duration num;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  FormatSpec<char,_int,_int,_int,_int,_int,_long,_int,_std::basic_string_view<char>,_int,_const_char_*,_std::basic_string_view<char>_>
  local_58;
  Duration local_48;
  char *local_38;
  
  local_48.rep_hi_ = civil_second.f_._8_8_;
  local_58.super_type.spec_.data_ = "%c%02d%02d %02d:%02d:%02d.%06d %7d %s:%d] %s%s";
  local_58.super_type.spec_.size_ = 0x2e;
  if ((uint)this < 4) {
    args = (&PTR_anon_var_dwarf_5f80583_01917cd8)[(ulong)this & 0xffffffff];
  }
  else {
    args = "UNKNOWN";
  }
  local_5c = (int)(char)civil_second.f_.y;
  local_60 = (int)civil_second.f_.y._1_1_;
  local_64 = (int)civil_second.f_.y._2_1_;
  local_68 = (int)civil_second.f_.y >> 0x18;
  local_6c = civil_second.f_.y._1_4_ >> 0x18;
  if ((ulong)local_48.rep_hi_ >> 0x2b == 0) {
    local_48.rep_hi_ = (HiRep)((ulong)(uint)tid / 4000 + (long)local_48.rep_hi_ * 1000000);
  }
  else {
    num.rep_lo_ = tid;
    num.rep_hi_ = local_48.rep_hi_;
    local_48.rep_lo_ = tid;
    local_48.rep_hi_ = (HiRep)IDivDuration(num,(Duration)(ZEXT412(4000) << 0x40),&local_48);
  }
  local_38 = anon_var_dwarf_a22956 + 5;
  if (line == 1) {
    local_38 = "RAW: ";
  }
  StrFormat<char,_int,_int,_int,_int,_int,_long,_int,_std::basic_string_view<char,_std::char_traits<char>_>,_int,_const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (__return_storage_ptr__,&local_58,args,&local_5c,&local_60,&local_64,&local_68,&local_6c
             ,(long *)&local_48,(int *)&subsecond,
             (basic_string_view<char,_std::char_traits<char>_> *)&subsecond.rep_lo_,
             (int *)&basename._M_str,&local_38,
             (basic_string_view<char,_std::char_traits<char>_> *)&format);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatLogMessage(absl::LogSeverity severity,
                             absl::CivilSecond civil_second,
                             absl::Duration subsecond, log_internal::Tid tid,
                             absl::string_view basename, int line,
                             PrefixFormat format, absl::string_view message) {
  return absl::StrFormat(
      "%c%02d%02d %02d:%02d:%02d.%06d %7d %s:%d] %s%s",
      absl::LogSeverityName(severity)[0], civil_second.month(),
      civil_second.day(), civil_second.hour(), civil_second.minute(),
      civil_second.second(), absl::ToInt64Microseconds(subsecond), tid,
      basename, line, format == PrefixFormat::kRaw ? "RAW: " : "", message);
}